

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

Event_handler * __thiscall
iqnet::Reactor<boost::mutex>::find_handler(Reactor<boost::mutex> *this,Handler fd)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  scoped_lock lk;
  unique_lock<boost::mutex> local_20;
  
  local_20.m = &this->lock;
  local_20.is_locked = false;
  boost::unique_lock<boost::mutex>::lock(&local_20);
  p_Var2 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var3 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var3->_M_header;
    do {
      if (fd <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < fd];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var3) && ((int)p_Var1[1]._M_color <= fd)) {
      p_Var2 = p_Var1[1]._M_parent;
      goto LAB_0014da61;
    }
  }
  p_Var2 = (_Base_ptr)0x0;
LAB_0014da61:
  if (local_20.is_locked == true) {
    boost::mutex::unlock(local_20.m);
  }
  return (Event_handler *)p_Var2;
}

Assistant:

iqnet::Event_handler* Reactor<Lock>::find_handler(Socket::Handler fd)
{
  scoped_lock lk(lock);
  h_iterator i = handlers.find(fd);
  return i == handlers.end() ? NULL : i->second;
}